

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  bool bVar1;
  TValue *pTVar2;
  byte bVar3;
  lua_CFunction p_Var4;
  
  pTVar2 = index2value(L,fidx);
  bVar3 = pTVar2->tt_ & 0x3f;
  if (bVar3 == 0x26) {
    bVar1 = true;
    if ((0 < n) && (n <= (int)(uint)(byte)(pTVar2->value_).f[10])) {
      pTVar2 = (TValue *)((pTVar2->value_).f + (ulong)(n - 1) * 0x10 + 0x20);
      bVar1 = false;
    }
    if (!bVar1) {
      return pTVar2;
    }
  }
  else if ((bVar3 != 0x16) && (bVar3 == 6)) {
    pTVar2 = index2value(L,fidx);
    p_Var4 = (lua_CFunction)&getupvalref_nullup;
    if ((0 < n) && (n <= *(int *)(*(long *)((pTVar2->value_).f + 0x18) + 0x10))) {
      p_Var4 = (pTVar2->value_).f + (ulong)(n - 1) * 8 + 0x20;
    }
    return *(void **)p_Var4;
  }
  return (void *)0x0;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  TValue *fi = index2value(L, fidx);
  switch (ttypetag(fi)) {
    case LUA_VLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL);
    }
    case LUA_VCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (1 <= n && n <= f->nupvalues)
        return &f->upvalue[n - 1];
      /* else */
    }  /* FALLTHROUGH */
    case LUA_VLCF:
      return NULL;  /* light C functions have no upvalues */
    default: {
      api_check(L, 0, "function expected");
      return NULL;
    }
  }
}